

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::IgnoreFile(cmGlobalGenerator *this,char *ext)

{
  size_type sVar1;
  bool bVar2;
  allocator<char> local_41;
  string local_40;
  
  GetLanguageFromExtension_abi_cxx11_(&local_40,this,ext);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_40._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,ext,&local_41);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ::count(&this->IgnoreExtensions,&local_40);
    bVar2 = sVar1 != 0;
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::IgnoreFile(const char* ext) const
{
  if (!this->GetLanguageFromExtension(ext).empty()) {
    return false;
  }
  return (this->IgnoreExtensions.count(ext) > 0);
}